

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.hpp
# Opt level: O1

void __thiscall
skiplist<int,std::less<int>>::
skiplist<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (skiplist<int,std::less<int>> *this,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0xc) = 0;
  *(undefined8 *)(this + 0x14) = 0;
  *(undefined8 *)(this + 0x28) = 0x1571;
  lVar1 = 1;
  uVar4 = 0x1571;
  lVar2 = 6;
  do {
    lVar3 = (uVar4 >> 0x3e ^ uVar4) * 0x5851f42d4c957f2d;
    uVar4 = lVar3 + lVar1;
    *(long *)(this + lVar2 * 8) = lVar2 + lVar3 + -5;
    lVar1 = lVar1 + 1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x13d);
  *(undefined8 *)(this + 0x9e8) = 0x138;
  *(undefined8 *)(this + 0x9f0) = 0;
  *(undefined8 *)(this + 0x9f8) = 0x3ff0000000000000;
  skiplist<int,_std::less<int>_>::_setup_random_number_generator
            ((skiplist<int,_std::less<int>_> *)this);
  for (; first._M_current != last._M_current; first._M_current = first._M_current + 1) {
    skiplist<int,_std::less<int>_>::insert((skiplist<int,_std::less<int>_> *)this,*first._M_current)
    ;
  }
  return;
}

Assistant:

skiplist(InputIterator first, InputIterator last): size_(0), last(nullptr) {
        _setup_random_number_generator();
        // last and size_ are taken care of during insertion.
        while(first != last) {
            insert(*first);
            ++first;
        }
    }